

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int tcptran_ep_set_recvmaxsz(void *arg,void *v,size_t sz,nni_opt_type t)

{
  int iVar1;
  uint64_t uStack_38;
  int rv;
  size_t val;
  tcptran_ep *ep;
  size_t sStack_20;
  nni_opt_type t_local;
  size_t sz_local;
  void *v_local;
  void *arg_local;
  
  val = (size_t)arg;
  ep._4_4_ = t;
  sStack_20 = sz;
  sz_local = (size_t)v;
  v_local = arg;
  iVar1 = nni_copyin_size(&stack0xffffffffffffffc8,v,sz,0,0xffffffff,t);
  if (iVar1 == 0) {
    nni_mtx_lock((nni_mtx *)val);
    *(uint64_t *)(val + 0x30) = uStack_38;
    nni_mtx_unlock((nni_mtx *)val);
    nni_stat_set_value((nni_stat_item *)(val + 0x430),uStack_38);
  }
  return iVar1;
}

Assistant:

static int
tcptran_ep_set_recvmaxsz(void *arg, const void *v, size_t sz, nni_opt_type t)
{
	tcptran_ep *ep = arg;
	size_t      val;
	int         rv;
	if ((rv = nni_copyin_size(&val, v, sz, 0, NNI_MAXSZ, t)) == 0) {
		nni_mtx_lock(&ep->mtx);
		ep->rcvmax = val;
		nni_mtx_unlock(&ep->mtx);
#ifdef NNG_ENABLE_STATS
		nni_stat_set_value(&ep->st_rcv_max, val);
#endif
	}
	return (rv);
}